

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O1

void __thiscall
ParseNodeParamPattern::ParseNodeParamPattern
          (ParseNodeParamPattern *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  (this->super_ParseNodeUni).super_ParseNode.nop = nop;
  (this->super_ParseNodeUni).super_ParseNode.grfpn = 0;
  (this->super_ParseNodeUni).super_ParseNode.location = 0xffffffff;
  (this->super_ParseNodeUni).super_ParseNode.field_0x1 =
       ((this->super_ParseNodeUni).super_ParseNode.field_0x1 & 0xe0) + 1;
  (this->super_ParseNodeUni).super_ParseNode.ichMin = ichMin;
  (this->super_ParseNodeUni).super_ParseNode.ichLim = ichLim;
  (this->super_ParseNodeUni).pnode1 = (ParseNodePtr)0x0;
  return;
}

Assistant:

ParseNodeParamPattern::ParseNodeParamPattern(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeUni(nop, ichMin, ichLim, nullptr)
{
}